

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idasAkzoNob_dns.c
# Opt level: O0

int res(sunrealtype t,N_Vector yy,N_Vector yd,N_Vector resval,void *userdata)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double __x;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  double *in_RCX;
  long *in_RDX;
  long *in_RSI;
  long *in_RDI;
  double dVar17;
  double dVar18;
  double dVar19;
  double dVar20;
  sunrealtype Fin;
  sunrealtype r5;
  sunrealtype r4;
  sunrealtype r3;
  sunrealtype r2;
  sunrealtype r1;
  sunrealtype yd5;
  sunrealtype yd4;
  sunrealtype yd3;
  sunrealtype yd2;
  sunrealtype yd1;
  sunrealtype y6;
  sunrealtype y5;
  sunrealtype y4;
  sunrealtype y3;
  sunrealtype y2;
  sunrealtype y1;
  sunrealtype H;
  sunrealtype pCO2;
  sunrealtype Ks;
  sunrealtype klA;
  sunrealtype K;
  sunrealtype k4;
  sunrealtype k3;
  sunrealtype k2;
  sunrealtype k1;
  UserData data;
  double local_128;
  double local_118;
  
  dVar18 = *in_RCX;
  dVar20 = in_RCX[1];
  dVar1 = in_RCX[2];
  dVar2 = in_RCX[3];
  dVar3 = in_RCX[4];
  dVar4 = in_RCX[5];
  dVar5 = in_RCX[6];
  dVar6 = in_RCX[7];
  dVar7 = in_RCX[8];
  dVar8 = **(double **)(*in_RDI + 0x10);
  __x = *(double *)(*(long *)(*in_RDI + 0x10) + 8);
  dVar9 = *(double *)(*(long *)(*in_RDI + 0x10) + 0x10);
  dVar10 = *(double *)(*(long *)(*in_RDI + 0x10) + 0x18);
  dVar19 = *(double *)(*(long *)(*in_RDI + 0x10) + 0x20);
  dVar11 = *(double *)(*(long *)(*in_RDI + 0x10) + 0x28);
  dVar12 = **(double **)(*in_RSI + 0x10);
  dVar13 = *(double *)(*(long *)(*in_RSI + 0x10) + 8);
  dVar14 = *(double *)(*(long *)(*in_RSI + 0x10) + 0x10);
  dVar15 = *(double *)(*(long *)(*in_RSI + 0x10) + 0x18);
  dVar16 = *(double *)(*(long *)(*in_RSI + 0x10) + 0x20);
  dVar17 = (double)SUNRpowerI(dVar8,4);
  if (0.0 < __x) {
    local_118 = sqrt(__x);
  }
  else {
    local_118 = 0.0;
  }
  local_118 = dVar18 * dVar17 * local_118;
  dVar18 = dVar20 * dVar9 * dVar10;
  dVar19 = (dVar20 / dVar3) * dVar8 * dVar19;
  dVar20 = dVar1 * dVar8 * dVar10 * dVar10;
  if (0.0 < __x) {
    local_128 = sqrt(__x);
  }
  else {
    local_128 = 0.0;
  }
  local_128 = dVar2 * dVar11 * dVar11 * local_128;
  **(double **)(*in_RDX + 0x10) = ((local_118 + local_118 + dVar12) - dVar18) + dVar19 + dVar20;
  *(double *)(*(long *)(*in_RDX + 0x10) + 8) =
       (local_128 * 0.5 + local_118 * 0.5 + dVar13 + dVar20) - dVar4 * (dVar6 / dVar7 - __x);
  *(double *)(*(long *)(*in_RDX + 0x10) + 0x10) = ((dVar14 - local_118) + dVar18) - dVar19;
  *(double *)(*(long *)(*in_RDX + 0x10) + 0x18) = dVar20 + dVar20 + ((dVar15 + dVar18) - dVar19);
  *(double *)(*(long *)(*in_RDX + 0x10) + 0x20) = ((dVar16 - dVar18) + dVar19) - local_128;
  *(double *)(*(long *)(*in_RDX + 0x10) + 0x28) = dVar5 * dVar8 * dVar10 + -dVar11;
  return 0;
}

Assistant:

static int res(sunrealtype t, N_Vector yy, N_Vector yd, N_Vector resval,
               void* userdata)
{
  UserData data;
  sunrealtype k1, k2, k3, k4;
  sunrealtype K, klA, Ks, pCO2, H;

  sunrealtype y1, y2, y3, y4, y5, y6;
  sunrealtype yd1, yd2, yd3, yd4, yd5;

  sunrealtype r1, r2, r3, r4, r5, Fin;

  data = (UserData)userdata;
  k1   = data->k1;
  k2   = data->k2;
  k3   = data->k3;
  k4   = data->k4;
  K    = data->K;
  klA  = data->klA;
  Ks   = data->Ks;
  pCO2 = data->pCO2;
  H    = data->H;

  y1 = Ith(yy, 1);
  y2 = Ith(yy, 2);
  y3 = Ith(yy, 3);
  y4 = Ith(yy, 4);
  y5 = Ith(yy, 5);
  y6 = Ith(yy, 6);

  yd1 = Ith(yd, 1);
  yd2 = Ith(yd, 2);
  yd3 = Ith(yd, 3);
  yd4 = Ith(yd, 4);
  yd5 = Ith(yd, 5);

  r1  = k1 * SUNRpowerI(y1, 4) * SUNRsqrt(y2);
  r2  = k2 * y3 * y4;
  r3  = k2 / K * y1 * y5;
  r4  = k3 * y1 * y4 * y4;
  r5  = k4 * y6 * y6 * SUNRsqrt(y2);
  Fin = klA * (pCO2 / H - y2);

  Ith(resval, 1) = yd1 + TWO * r1 - r2 + r3 + r4;
  Ith(resval, 2) = yd2 + HALF * r1 + r4 + HALF * r5 - Fin;
  Ith(resval, 3) = yd3 - r1 + r2 - r3;
  Ith(resval, 4) = yd4 + r2 - r3 + TWO * r4;
  Ith(resval, 5) = yd5 - r2 + r3 - r5;
  Ith(resval, 6) = Ks * y1 * y4 - y6;

  return (0);
}